

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O3

void __thiscall CaDiCaL::External::check_solution_on_learned_clause(External *this)

{
  char cVar1;
  uint uVar2;
  Internal *pIVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  int *lit;
  uint *puVar7;
  char cVar8;
  uint uVar9;
  
  pIVar3 = this->internal;
  puVar7 = (uint *)(pIVar3->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  puVar4 = (uint *)(pIVar3->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar7 != puVar4) {
    do {
      uVar2 = *puVar7;
      uVar9 = -uVar2;
      if (0 < (int)uVar2) {
        uVar9 = uVar2;
      }
      uVar9 = (pIVar3->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      uVar5 = uVar9;
      if ((int)uVar9 < 1) {
        uVar5 = -uVar9;
      }
      uVar6 = -uVar9;
      if (-1 < (int)uVar2) {
        uVar6 = uVar9;
      }
      uVar9 = 0;
      if (((int)uVar5 <= this->max_var) && (cVar1 = this->solution[uVar5], cVar1 != '\0')) {
        cVar8 = -cVar1;
        if (-1 < (int)uVar6) {
          cVar8 = cVar1;
        }
        uVar9 = uVar6;
        if (cVar8 < '\x01') {
          uVar9 = -uVar6;
        }
      }
      if (uVar9 == uVar2) {
        return;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar4);
  }
  check_solution_on_learned_clause(this);
  return;
}

Assistant:

void External::check_solution_on_learned_clause () {
  assert (solution);
  for (const auto &lit : internal->clause)
    if (sol (internal->externalize (lit)) == lit)
      return;
  fatal_message_start ();
  fputs ("learned clause unsatisfied by solution:\n", stderr);
  for (const auto &lit : internal->clause)
    fprintf (stderr, "%d ", lit);
  fputc ('0', stderr);
  fatal_message_end ();
}